

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DeepTiledInputFile::compatibilityInitialize(DeepTiledInputFile *this,IStream *is)

{
  MultiPartInputFile *this_00;
  long *in_RSI;
  long in_RDI;
  InputPartData *part;
  InputPartData *in_stack_000001a8;
  undefined4 in_stack_000001b0;
  int in_stack_000001b4;
  IStream *in_stack_000001b8;
  MultiPartInputFile *in_stack_000001c0;
  
  (**(code **)(*in_RSI + 0x30))(in_RSI,0);
  this_00 = (MultiPartInputFile *)operator_new(0x10);
  MultiPartInputFile::MultiPartInputFile
            (in_stack_000001c0,in_stack_000001b8,in_stack_000001b4,in_stack_000001b0._3_1_);
  *(MultiPartInputFile **)(*(long *)(in_RDI + 8) + 0x168) = this_00;
  *(undefined1 *)(*(long *)(in_RDI + 8) + 0x15c) = 1;
  MultiPartInputFile::getPart(this_00,(int)((ulong)in_RDI >> 0x20));
  multiPartInitialize((DeepTiledInputFile *)CONCAT44(in_stack_000001b4,in_stack_000001b0),
                      in_stack_000001a8);
  return;
}

Assistant:

void
DeepTiledInputFile::compatibilityInitialize(OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is)
{
    is.seekg(0);
    //
    // Construct a MultiPartInputFile, initialize TiledInputFile
    // with the part 0 data.
    // (TODO) maybe change the third parameter of the constructor of MultiPartInputFile later.
    //
    _data->multiPartFile = new MultiPartInputFile(is, _data->numThreads);
    _data->multiPartBackwardSupport = true;
    InputPartData* part = _data->multiPartFile->getPart(0);

    multiPartInitialize(part);
}